

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

char * slurpfile(size_t *sizep,char *fmt,...)

{
  char in_AL;
  int iVar1;
  FILE *__stream;
  char *__ptr;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  stat st;
  char filename [8192];
  undefined8 local_2188;
  void **local_2180;
  undefined1 *local_2178;
  stat local_2168;
  undefined1 local_20d8 [16];
  undefined8 local_20c8;
  undefined8 local_20c0;
  undefined8 local_20b8;
  undefined8 local_20b0;
  undefined8 local_20a8;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  undefined8 local_2038;
  char local_2028 [8200];
  
  local_2178 = local_20d8;
  if (in_AL != '\0') {
    local_20a8 = in_XMM0_Qa;
    local_2098 = in_XMM1_Qa;
    local_2088 = in_XMM2_Qa;
    local_2078 = in_XMM3_Qa;
    local_2068 = in_XMM4_Qa;
    local_2058 = in_XMM5_Qa;
    local_2048 = in_XMM6_Qa;
    local_2038 = in_XMM7_Qa;
  }
  local_2180 = &ap[0].overflow_arg_area;
  local_2188 = 0x3000000010;
  local_20c8 = in_RDX;
  local_20c0 = in_RCX;
  local_20b8 = in_R8;
  local_20b0 = in_R9;
  vsnprintf(local_2028,0x2000,fmt,&local_2188);
  __stream = fopen(local_2028,"rb");
  if (__stream == (FILE *)0x0) {
LAB_001050c0:
    __ptr = (char *)0x0;
  }
  else {
    iVar1 = fileno(__stream);
    iVar1 = fstat(iVar1,&local_2168);
    if (iVar1 == 0) {
      __ptr = (char *)malloc(local_2168.st_size + 1);
      if (__ptr == (char *)0x0) {
        __ptr = (char *)0x0;
        logprintf("Can\'t allocate %ld bytes of memory to read file %s\n",local_2168.st_size,
                  local_2028);
      }
      else {
        sVar2 = fread(__ptr,1,local_2168.st_size,__stream);
        if ((long)sVar2 < local_2168.st_size) {
          logprintf("Can\'t read file %s\n",local_2028);
          fclose(__stream);
          free(__ptr);
          goto LAB_001050c0;
        }
        __ptr[local_2168.st_size] = '\0';
        if (sizep != (size_t *)0x0) {
          *sizep = local_2168.st_size;
        }
      }
    }
    else {
      __ptr = (char *)0x0;
      logprintf("Can\'t stat file %s\n",local_2028);
    }
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

char *
slurpfile(size_t * sizep, const char *fmt, ...)
{
	char filename[8192];
	struct stat st;
	va_list ap;
	char *p;
	ssize_t bytes_read;
	FILE *f;
	int r;

	va_start(ap, fmt);
	vsnprintf(filename, sizeof(filename), fmt, ap);
	va_end(ap);

	f = fopen(filename, "rb");
	if (f == NULL) {
		/* Note: No error; non-existent file is okay here. */
		return (NULL);
	}
	r = fstat(fileno(f), &st);
	if (r != 0) {
		logprintf("Can't stat file %s\n", filename);
		fclose(f);
		return (NULL);
	}
	p = malloc((size_t)st.st_size + 1);
	if (p == NULL) {
		logprintf("Can't allocate %ld bytes of memory to read file %s\n",
		    (long int)st.st_size, filename);
		fclose(f);
		return (NULL);
	}
	bytes_read = fread(p, 1, (size_t)st.st_size, f);
	if (bytes_read < st.st_size) {
		logprintf("Can't read file %s\n", filename);
		fclose(f);
		free(p);
		return (NULL);
	}
	p[st.st_size] = '\0';
	if (sizep != NULL)
		*sizep = (size_t)st.st_size;
	fclose(f);
	return (p);
}